

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O0

void lj_gc_barrieruv(global_State *g,TValue *tv)

{
  long in_RSI;
  GCobj *in_RDI;
  global_State *unaff_retaddr;
  
  if ((*(char *)((long)in_RDI + 0x59) == '\x01') || (*(char *)((long)in_RDI + 0x59) == '\x02')) {
    gc_mark(unaff_retaddr,in_RDI);
  }
  else {
    *(byte *)(in_RSI + -4) = *(byte *)(in_RSI + -4) & 0xf8 | *(byte *)((long)in_RDI + 0x58) & 3;
  }
  return;
}

Assistant:

void LJ_FASTCALL lj_gc_barrieruv(global_State *g, TValue *tv)
{
#define TV2MARKED(x) \
  (*((uint8_t *)(x) - offsetof(GCupval, tv) + offsetof(GCupval, marked)))
  if (g->gc.state == GCSpropagate || g->gc.state == GCSatomic)
    gc_mark(g, gcV(tv));
  else
    TV2MARKED(tv) = (TV2MARKED(tv) & (uint8_t)~LJ_GC_COLORS) | curwhite(g);
#undef TV2MARKED
}